

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O0

void t_generator::parse_options
               (string *options,string *language,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *parsed_options)

{
  ulong uVar1;
  long lVar2;
  mapped_type *this;
  bool bVar3;
  size_type local_128;
  string local_110 [32];
  string local_f0 [48];
  string local_c0 [8];
  string value;
  string key;
  size_type separator;
  string option;
  size_type next_pos;
  size_type pos;
  long local_28;
  size_type colon;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *parsed_options_local;
  string *language_local;
  string *options_local;
  
  colon = (size_type)parsed_options;
  parsed_options_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)language;
  language_local = options;
  local_28 = std::__cxx11::string::find((char)options,0x3a);
  std::__cxx11::string::substr((ulong)&pos,(ulong)language_local);
  std::__cxx11::string::operator=((string *)parsed_options_local,(string *)&pos);
  std::__cxx11::string::~string((string *)&pos);
  if (local_28 != -1) {
    next_pos = local_28 + 1;
    while( true ) {
      bVar3 = false;
      if (next_pos != 0xffffffffffffffff) {
        uVar1 = std::__cxx11::string::size();
        bVar3 = next_pos < uVar1;
      }
      if (!bVar3) break;
      option.field_2._8_8_ = std::__cxx11::string::find((char)language_local,0x2c);
      std::__cxx11::string::substr((ulong)&separator,(ulong)language_local);
      if (option.field_2._8_8_ == -1) {
        local_128 = option.field_2._8_8_;
      }
      else {
        local_128 = option.field_2._8_8_ + 1;
      }
      next_pos = local_128;
      lVar2 = std::__cxx11::string::find((char)&separator,0x3d);
      std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_c0);
      if (lVar2 == -1) {
        std::__cxx11::string::operator=
                  ((string *)(value.field_2._M_local_buf + 8),(string *)&separator);
        std::__cxx11::string::operator=(local_c0,"");
      }
      else {
        std::__cxx11::string::substr((ulong)local_f0,(ulong)&separator);
        std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),local_f0);
        std::__cxx11::string::~string(local_f0);
        std::__cxx11::string::substr((ulong)local_110,(ulong)&separator);
        std::__cxx11::string::operator=(local_c0,local_110);
        std::__cxx11::string::~string(local_110);
      }
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)colon,(key_type *)((long)&value.field_2 + 8));
      std::__cxx11::string::operator=((string *)this,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&separator);
    }
  }
  return;
}

Assistant:

void t_generator::parse_options(const string& options,
                                string& language,
                                map<string, string>& parsed_options) {
  string::size_type colon = options.find(':');
  language = options.substr(0, colon);

  if (colon != string::npos) {
    string::size_type pos = colon + 1;
    while (pos != string::npos && pos < options.size()) {
      string::size_type next_pos = options.find(',', pos);
      string option = options.substr(pos, next_pos - pos);
      pos = ((next_pos == string::npos) ? next_pos : next_pos + 1);

      string::size_type separator = option.find('=');
      string key, value;
      if (separator == string::npos) {
        key = option;
        value = "";
      } else {
        key = option.substr(0, separator);
        value = option.substr(separator + 1);
      }

      parsed_options[key] = value;
    }
  }
}